

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O2

void __thiscall DStrifeStatusBar::DrINumber(DStrifeStatusBar *this,int val,int x,int y,int imgBase)

{
  FTexture *pFVar1;
  int x_00;
  
  x_00 = x + -7;
  if (val == 0) {
    pFVar1 = FImageCollection::operator[](&this->Images,imgBase);
    DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar1,x_00,y,(FRemapTable *)0x0);
    return;
  }
  for (; val != 0; val = val / 10) {
    pFVar1 = FImageCollection::operator[](&this->Images,val % 10 + imgBase);
    DBaseStatusBar::DrawImage(&this->super_DBaseStatusBar,pFVar1,x_00,y,(FRemapTable *)0x0);
    x_00 = x_00 + -7;
  }
  return;
}

Assistant:

void DrINumber (signed int val, int x, int y, int imgBase) const
	{
		x -= 7;

		if (val == 0)
		{
			DrawImage (Images[imgBase], x, y);
		}
		else
		{
			while (val != 0)
			{
				DrawImage (Images[imgBase+val%10], x, y);
				val /= 10;
				x -= 7;
			}
		}
	}